

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O3

uint spvc_compiler_msl_get_automatic_resource_binding_secondary
               (spvc_compiler compiler,spvc_variable_id id)

{
  spvc_context this;
  uint32_t uVar1;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  if (compiler->backend == SPVC_BACKEND_MSL) {
    uVar1 = spirv_cross::CompilerMSL::get_automatic_msl_resource_binding_secondary
                      ((CompilerMSL *)
                       (compiler->compiler)._M_t.
                       super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
                       .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl,id);
    return uVar1;
  }
  this = compiler->context;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_38,"MSL function used on a non-MSL backend.","");
  std::__cxx11::string::operator=((string *)this,(string *)local_38);
  if (this->callback != (spvc_error_callback)0x0) {
    (*this->callback)(this->callback_userdata,(this->last_error)._M_dataplus._M_p);
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return 0xffffffff;
}

Assistant:

unsigned spvc_compiler_msl_get_automatic_resource_binding_secondary(spvc_compiler compiler, spvc_variable_id id)
{
#if SPIRV_CROSS_C_API_MSL
	if (compiler->backend != SPVC_BACKEND_MSL)
	{
		compiler->context->report_error("MSL function used on a non-MSL backend.");
		return uint32_t(-1);
	}

	auto &msl = *static_cast<CompilerMSL *>(compiler->compiler.get());
	return msl.get_automatic_msl_resource_binding_secondary(id);
#else
	(void)id;
	compiler->context->report_error("MSL function used on a non-MSL backend.");
	return uint32_t(-1);
#endif
}